

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O1

int dodiscovered(void)

{
  nh_menuitem *pnVar1;
  byte let;
  short sVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  byte *__dest;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  menulist menu;
  char classes [18];
  char buf [256];
  menulist local_178;
  uint local_168;
  int local_164;
  byte *local_160;
  byte local_158 [32];
  char local_138 [264];
  
  init_menulist(&local_178);
  lVar3 = (long)local_178.size;
  if (local_178.size <= local_178.icount) {
    local_178.size = local_178.size * 2;
    local_178.items = (nh_menuitem *)realloc(local_178.items,lVar3 * 0x218);
  }
  lVar3 = (long)local_178.icount;
  local_178.items[lVar3].id = 0;
  local_178.items[lVar3].role = MI_TEXT;
  local_178.items[lVar3].accel = '\0';
  local_178.items[lVar3].group_accel = '\0';
  local_178.items[lVar3].selected = '\0';
  builtin_strncpy(local_178.items[lVar3].caption,"Discover",8);
  builtin_strncpy(local_178.items[lVar3].caption + 8,"ies",4);
  local_178.icount = local_178.icount + 1;
  lVar3 = (long)local_178.size;
  if (local_178.size <= local_178.icount) {
    local_178.size = local_178.size * 2;
    local_178.items = (nh_menuitem *)realloc(local_178.items,lVar3 * 0x218);
  }
  lVar3 = (long)local_178.icount;
  local_178.items[lVar3].accel = '\0';
  local_178.items[lVar3].group_accel = '\0';
  local_178.items[lVar3].selected = '\0';
  local_178.items[lVar3].caption[0] = '\0';
  local_178.items[lVar3].id = 0;
  local_178.items[lVar3].role = MI_TEXT;
  local_178.icount = local_178.icount + 1;
  lVar3 = 0;
  iVar8 = 0;
  iVar7 = 0;
  do {
    sVar2 = *(short *)((long)uniq_objs + lVar3);
    if ((objects[sVar2].field_0x10 & 1) != 0) {
      if (iVar8 == 0) {
        lVar4 = (long)local_178.size;
        if (local_178.size <= local_178.icount) {
          local_178.size = local_178.size * 2;
          local_178.items = (nh_menuitem *)realloc(local_178.items,lVar4 * 0x218);
        }
        lVar4 = (long)local_178.icount;
        local_178.items[lVar4].id = 0;
        local_178.items[lVar4].role = MI_HEADING;
        local_178.items[lVar4].accel = '\0';
        local_178.items[lVar4].group_accel = '\0';
        local_178.items[lVar4].selected = '\0';
        builtin_strncpy(local_178.items[lVar4].caption,"Unique I",8);
        builtin_strncpy(local_178.items[lVar4].caption + 5,"e Items",8);
        local_178.icount = local_178.icount + 1;
      }
      sprintf(local_138,"  %s",obj_descr[objects[sVar2].oc_name_idx].oc_name);
      lVar4 = (long)local_178.size;
      if (local_178.size <= local_178.icount) {
        local_178.size = local_178.size * 2;
        local_178.items = (nh_menuitem *)realloc(local_178.items,lVar4 * 0x218);
      }
      iVar8 = iVar8 + 1;
      pnVar1 = local_178.items + local_178.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_138);
      local_178.icount = local_178.icount + 1;
      iVar7 = iVar7 + 1;
    }
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  iVar8 = disp_artifact_discoveries(&local_178);
  __dest = local_158;
  strcpy((char *)__dest,flags.inv_order);
  pcVar5 = strchr((char *)__dest,0x11);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = eos((char *)local_158);
    pcVar5[0] = '\x11';
    pcVar5[1] = '\0';
  }
  iVar8 = iVar8 + iVar7;
  let = local_158[0];
  do {
    if (let == 0) {
      if (iVar8 == 0) {
        pline("You haven\'t discovered anything yet...");
      }
      else {
        display_menu(local_178.items,local_178.icount,(char *)0x0,0,(int *)0x0);
      }
      free(local_178.items);
      return 0;
    }
    lVar3 = (long)bases[(char)let];
    local_160 = __dest;
    if (lVar3 < 0x21a) {
      local_168 = let + 1;
      lVar4 = lVar3 * 0x14;
      do {
        lVar9 = lVar3 + 1;
        if ((&objects->oc_class)[lVar4 * 2] != let) break;
        iVar7 = (int)(&spl_book[0x2c].sp_id)[lVar3];
        if (((&spl_book[0x2c].sp_id)[lVar3] != 0) &&
           ((objects[iVar7].oc_uname != (char *)0x0 ||
            (((objects[iVar7].field_0x10 & 1) != 0 &&
             (obj_descr[objects[iVar7].oc_descr_idx].oc_descr != (char *)0x0)))))) {
          bVar10 = let != (byte)local_168;
          local_164 = iVar8;
          if (bVar10) {
            lVar3 = (long)local_178.size;
            if (local_178.size <= local_178.icount) {
              local_178.size = local_178.size * 2;
              local_178.items = (nh_menuitem *)realloc(local_178.items,lVar3 * 0x218);
            }
            pnVar1 = local_178.items + local_178.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_HEADING;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            pcVar5 = let_to_name(let,'\0');
            strcpy(pnVar1->caption,pcVar5);
            local_178.icount = local_178.icount + 1;
            local_168 = (uint)let;
          }
          pcVar5 = "*";
          if ((objects[iVar7].field_0x10 & 8) == 0) {
            pcVar5 = " ";
          }
          pcVar6 = obj_typename(iVar7);
          sprintf(local_138,"%s %s",pcVar5,pcVar6);
          lVar3 = (long)local_178.size;
          if (local_178.size <= local_178.icount) {
            local_178.size = local_178.size * 2;
            local_178.items = (nh_menuitem *)realloc(local_178.items,lVar3 * 0x218);
          }
          iVar8 = local_164 + 1;
          pnVar1 = local_178.items + local_178.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_178.icount = local_178.icount + 1;
        }
        lVar4 = lVar4 + 0x14;
        lVar3 = lVar9;
      } while ((int)lVar9 != 0x21a);
    }
    let = local_160[1];
    __dest = local_160 + 1;
  } while( true );
}

Assistant:

int dodiscovered(void)
{
    int i, dis;
    int	ct = 0;
    char *s, oclass, prev_class, classes[MAXOCLASSES];
    struct menulist menu;
    char buf[BUFSZ];

    init_menulist(&menu);
    add_menutext(&menu, "Discoveries");
    add_menutext(&menu, "");

    /* gather "unique objects" into a pseudo-class; note that they'll
       also be displayed individually within their regular class */
    for (i = dis = 0; i < SIZE(uniq_objs); i++)
	if (objects[uniq_objs[i]].oc_name_known) {
	    if (!dis++)
		add_menuheading(&menu, "Unique Items");
	    sprintf(buf, "  %s", OBJ_NAME(objects[uniq_objs[i]]));
	    add_menutext(&menu, buf);
	    ++ct;
	}
    /* display any known artifacts as another pseudo-class */
    ct += disp_artifact_discoveries(&menu);

    /* several classes are omitted from packorder; one is of interest here */
    strcpy(classes, flags.inv_order);
    if (!strchr(classes, VENOM_CLASS)) {
	s = eos(classes);
	*s++ = VENOM_CLASS;
	*s = '\0';
    }

    for (s = classes; *s; s++) {
	oclass = *s;
	prev_class = oclass + 1;	/* forced different from oclass */
	for (i = bases[(int)oclass];
	     i < NUM_OBJECTS && objects[i].oc_class == oclass; i++) {
	    if ((dis = disco[i]) && interesting_to_discover(dis)) {
		ct++;
		if (oclass != prev_class) {
		    add_menuheading(&menu, let_to_name(oclass, FALSE));
		    prev_class = oclass;
		}
		sprintf(buf, "%s %s",(objects[dis].oc_pre_discovered ? "*" : " "),
				obj_typename(dis));
		add_menutext(&menu, buf);
	    }
	}
    }
    if (ct == 0) {
	pline("You haven't discovered anything yet...");
    } else
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}